

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

string * __thiscall
ftxui::(anonymous_namespace)::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
          *parameters)

{
  bool bVar1;
  bool bVar2;
  reference pDVar3;
  string local_70;
  DECMode local_3c;
  iterator iStack_38;
  DECMode parameter;
  iterator __end2;
  iterator __begin2;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *__range2;
  bool first;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters_local;
  string *out;
  
  bVar1 = true;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::
           vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
           ::begin((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    *)this);
  iStack_38 = std::
              vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              ::end((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                     *)this);
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar2) {
    pDVar3 = __gnu_cxx::
             __normal_iterator<ftxui::(anonymous_namespace)::DECMode_*,_std::vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>_>
             ::operator*(&__end2);
    local_3c = *pDVar3;
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
    }
    std::__cxx11::to_string(&local_70,local_3c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<ftxui::(anonymous_namespace)::DECMode_*,_std::vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Serialize(std::vector<DECMode> parameters) {
  bool first = true;
  std::string out;
  for (DECMode parameter : parameters) {
    if (!first)
      out += ";";
    out += std::to_string(int(parameter));
    first = false;
  }
  return out;
}